

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O1

SQNativeClosure * __thiscall SQNativeClosure::Clone(SQNativeClosure *this)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  SQObjectType SVar3;
  SQObjectType SVar4;
  uint uVar5;
  uint uVar6;
  SQWeakRef *pSVar7;
  SQTable *pSVar8;
  SQObjectPtr *pSVar9;
  SQObjectPtr *pSVar10;
  long *plVar11;
  SQNativeClosure *pSVar12;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_01;
  long lVar13;
  long lVar14;
  
  pSVar12 = Create((this->super_SQCollectable)._sharedstate,this->_function,this->_noutervalues);
  pSVar7 = this->_env;
  pSVar12->_env = pSVar7;
  if (pSVar7 != (SQWeakRef *)0x0) {
    pSVar1 = &(pSVar7->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SVar3 = (pSVar12->_name).super_SQObject._type;
  pSVar8 = (pSVar12->_name).super_SQObject._unVal.pTable;
  (pSVar12->_name).super_SQObject._unVal = (this->_name).super_SQObject._unVal;
  SVar4 = (this->_name).super_SQObject._type;
  (pSVar12->_name).super_SQObject._type = SVar4;
  if ((SVar4 >> 0x1b & 1) != 0) {
    pSVar1 = &(((pSVar12->_name).super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  src = extraout_RDX;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
      src = extraout_RDX_00;
    }
  }
  if (0 < (long)this->_noutervalues) {
    lVar14 = 8;
    lVar13 = 0;
    do {
      pSVar9 = this->_outervalues;
      pSVar10 = pSVar12->_outervalues;
      uVar5 = *(uint *)((long)pSVar10 + lVar14 + -8);
      plVar11 = *(long **)((long)&(pSVar10->super_SQObject)._type + lVar14);
      *(undefined8 *)((long)&(pSVar10->super_SQObject)._type + lVar14) =
           *(undefined8 *)((long)&(pSVar9->super_SQObject)._type + lVar14);
      uVar6 = *(uint *)((long)pSVar9 + lVar14 + -8);
      src = (EVP_PKEY_CTX *)(ulong)uVar6;
      *(uint *)((long)pSVar10 + lVar14 + -8) = uVar6;
      if ((uVar6 >> 0x1b & 1) != 0) {
        plVar2 = (long *)(*(long *)((long)&(pSVar10->super_SQObject)._type + lVar14) + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar5 >> 0x1b & 1) != 0) {
        plVar2 = plVar11 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar11 + 0x10))();
          src = extraout_RDX_01;
        }
      }
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x10;
    } while (lVar13 < (long)this->_noutervalues);
  }
  sqvector<long_long>::copy(&pSVar12->_typecheck,(EVP_PKEY_CTX *)&this->_typecheck,src);
  pSVar12->_nparamscheck = this->_nparamscheck;
  return pSVar12;
}

Assistant:

SQNativeClosure *Clone()
    {
        SQNativeClosure * ret = SQNativeClosure::Create(_opt_ss(this),_function,_noutervalues);
        ret->_env = _env;
        if(ret->_env) __ObjAddRef(ret->_env);
        ret->_name = _name;
        _COPY_VECTOR(ret->_outervalues,_outervalues,_noutervalues);
        ret->_typecheck.copy(_typecheck);
        ret->_nparamscheck = _nparamscheck;
        return ret;
    }